

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<double,_TPZDohrSubstruct<double>_>::TPZDohrPrecond
          (TPZDohrPrecond<double,_TPZDohrSubstruct<double>_> *this,void **vtt,
          TPZDohrPrecond<double,_TPZDohrSubstruct<double>_> *cp)

{
  undefined8 uVar1;
  list<TPZAutoPointer<TPZDohrSubstruct<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<double>_>_>_>
  *in_RDX;
  TPZMatrix<double> *in_RSI;
  undefined8 *in_RDI;
  TPZAutoPointer<TPZDohrAssembly<double>_> *in_stack_ffffffffffffffa8;
  TPZMatrix<double> *in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  TPZMatrix<double> *this_00;
  
  this_00 = in_RSI;
  TPZMatrix<double>::TPZMatrix(in_RSI,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  *in_RDI = (in_RSI->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
  std::__cxx11::
  list<TPZAutoPointer<TPZDohrSubstruct<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<double>_>_>_>
  ::list((list<TPZAutoPointer<TPZDohrSubstruct<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<double>_>_>_>
          *)this_00,in_RDX);
  in_RDI[7] = 0;
  in_RDI[8] = in_RDX[2].
              super__List_base<TPZAutoPointer<TPZDohrSubstruct<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<double>_>_>_>
              ._M_impl._M_node._M_size;
  *(undefined4 *)(in_RDI + 9) =
       *(undefined4 *)
        &in_RDX[3].
         super__List_base<TPZAutoPointer<TPZDohrSubstruct<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<double>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
  TPZAutoPointer<TPZDohrAssembly<double>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZDohrAssembly<double>_> *)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  if (in_RDX[2].
      super__List_base<TPZAutoPointer<TPZDohrSubstruct<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<double>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev != (_List_node_base *)0x0) {
    uVar1 = (*(code *)(in_RDX[2].
                       super__List_base<TPZAutoPointer<TPZDohrSubstruct<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<double>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_prev)->_M_next[4]._M_prev)();
    in_RDI[7] = uVar1;
  }
  return;
}

Assistant:

TPZDohrPrecond<TVar, TSubStruct>::TPZDohrPrecond(const TPZDohrPrecond<TVar, TSubStruct> &cp) : TPZMatrix<TVar>(cp), fGlobal(cp.fGlobal), fCoarse(0),
fNumCoarse(cp.fNumCoarse), fNumThreads(cp.fNumThreads), fAssemble(cp.fAssemble)
{
	if (cp.fCoarse) {
		fCoarse = (TPZStepSolver<TVar> *) cp.fCoarse->Clone();
	}
}